

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFVerifier::verifyUnitHeader
          (DWARFVerifier *this,DWARFDataExtractor DebugInfoData,uint64_t *Offset,uint UnitIndex,
          uint8_t *UnitType,bool *isUnitDWARF64)

{
  size_t sVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  uint64_t CUAbbrOffset;
  DWARFDebugAbbrev *this_00;
  raw_ostream *prVar6;
  undefined1 DisableColors;
  ulong uVar7;
  bool bVar8;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  format_object_base local_88;
  uint64_t local_78;
  uint local_70;
  bool *local_68;
  DWARFAbbreviationDeclarationSet *local_60;
  uint64_t local_58;
  uint local_4c;
  ulong local_48;
  DWARFVerifier *local_40;
  uint local_38;
  bool local_31;
  
  DisableColors = SUB81(isUnitDWARF64,0);
  local_58 = *Offset;
  local_4c = UnitIndex;
  local_40 = this;
  uVar5 = DataExtractor::getU32(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
  if (uVar5 == 0xffffffff) {
    local_48 = DataExtractor::getU64(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
    *isUnitDWARF64 = true;
  }
  else {
    local_48 = (ulong)uVar5;
  }
  uVar4 = DataExtractor::getU16(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
  local_68 = isUnitDWARF64;
  if (uVar4 < 5) {
    *UnitType = '\0';
    if (*isUnitDWARF64 == true) {
      CUAbbrOffset = DataExtractor::getU64(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
    }
    else {
      uVar5 = DataExtractor::getU32(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
      CUAbbrOffset = (uint64_t)uVar5;
    }
    bVar3 = DataExtractor::getU8(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
    local_31 = true;
  }
  else {
    uVar2 = DataExtractor::getU8(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
    *UnitType = uVar2;
    uVar2 = DataExtractor::getU8(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
    local_38 = CONCAT31(local_38._1_3_,uVar2);
    if (*isUnitDWARF64 == true) {
      CUAbbrOffset = DataExtractor::getU64(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
    }
    else {
      uVar5 = DataExtractor::getU32(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
      CUAbbrOffset = (uint64_t)uVar5;
    }
    local_31 = (byte)(*UnitType - 1) < 6;
    bVar3 = (byte)local_38;
  }
  this_00 = DWARFContext::getDebugAbbrev(local_40->DCtx);
  local_60 = DWARFDebugAbbrev::getAbbreviationDeclarationSet(this_00,CUAbbrOffset);
  sVar1 = DebugInfoData.super_DataExtractor.Data.Length;
  uVar7 = local_48 + local_58 + 3;
  local_48 = local_48 + local_58;
  local_38 = (uint)bVar3;
  if ((((uVar4 - 6 < 0xfffffffc) || (DebugInfoData.super_DataExtractor.Data.Length <= uVar7)) ||
      ((bVar3 != 8 && (local_38 != 4)))) ||
     (bVar8 = true, (local_31 & local_60 != (DWARFAbbreviationDeclarationSet *)0x0) == 0)) {
    prVar6 = WithColor::error((WithColor *)local_40->OS,(raw_ostream *)0xe85cd6,
                              (StringRef)ZEXT816(0),(bool)DisableColors);
    local_88.Fmt = "Units[%d] - start offset: 0x%08lx \n";
    local_88._vptr_format_object_base = (_func_int **)&PTR_home_01098010;
    local_78 = local_58;
    local_70 = local_4c;
    raw_ostream::operator<<(prVar6,&local_88);
    if (sVar1 <= uVar7) {
      prVar6 = WithColor::note((WithColor *)local_40->OS,(raw_ostream *)0xe85cd6,
                               (StringRef)ZEXT816(0),(bool)DisableColors);
      Str.Length = 0x44;
      Str.Data = "The length for this unit is too large for the .debug_info provided.\n";
      raw_ostream::operator<<(prVar6,Str);
    }
    if (uVar4 - 6 < 0xfffffffc) {
      prVar6 = WithColor::note((WithColor *)local_40->OS,(raw_ostream *)0xe85cd6,
                               (StringRef)ZEXT816(0),(bool)DisableColors);
      Str_00.Length = 0x2d;
      Str_00.Data = "The 16 bit unit header version is not valid.\n";
      raw_ostream::operator<<(prVar6,Str_00);
    }
    if (local_31 == false) {
      prVar6 = WithColor::note((WithColor *)local_40->OS,(raw_ostream *)0xe85cd6,
                               (StringRef)ZEXT816(0),(bool)DisableColors);
      Str_01.Length = 0x25;
      Str_01.Data = "The unit type encoding is not valid.\n";
      raw_ostream::operator<<(prVar6,Str_01);
    }
    if (local_60 == (DWARFAbbreviationDeclarationSet *)0x0) {
      prVar6 = WithColor::note((WithColor *)local_40->OS,(raw_ostream *)0xe85cd6,
                               (StringRef)ZEXT816(0),(bool)DisableColors);
      Str_02.Length = 0x38;
      Str_02.Data = "The offset into the .debug_abbrev section is not valid.\n";
      raw_ostream::operator<<(prVar6,Str_02);
    }
    bVar8 = false;
    if ((bVar3 != 4) && (bVar8 = false, local_38 != 8)) {
      bVar8 = false;
      prVar6 = WithColor::note((WithColor *)local_40->OS,(raw_ostream *)0xe85cd6,
                               (StringRef)ZEXT816(0),(bool)DisableColors);
      Str_03.Length = 0x21;
      Str_03.Data = "The address size is unsupported.\n";
      raw_ostream::operator<<(prVar6,Str_03);
    }
  }
  *Offset = local_48 + (ulong)*local_68 * 8 + 4;
  return bVar8;
}

Assistant:

bool DWARFVerifier::verifyUnitHeader(const DWARFDataExtractor DebugInfoData,
                                     uint64_t *Offset, unsigned UnitIndex,
                                     uint8_t &UnitType, bool &isUnitDWARF64) {
  uint64_t AbbrOffset, Length;
  uint8_t AddrSize = 0;
  uint16_t Version;
  bool Success = true;

  bool ValidLength = false;
  bool ValidVersion = false;
  bool ValidAddrSize = false;
  bool ValidType = true;
  bool ValidAbbrevOffset = true;

  uint64_t OffsetStart = *Offset;
  Length = DebugInfoData.getU32(Offset);
  if (Length == dwarf::DW_LENGTH_DWARF64) {
    Length = DebugInfoData.getU64(Offset);
    isUnitDWARF64 = true;
  }
  Version = DebugInfoData.getU16(Offset);

  if (Version >= 5) {
    UnitType = DebugInfoData.getU8(Offset);
    AddrSize = DebugInfoData.getU8(Offset);
    AbbrOffset = isUnitDWARF64 ? DebugInfoData.getU64(Offset) : DebugInfoData.getU32(Offset);
    ValidType = dwarf::isUnitType(UnitType);
  } else {
    UnitType = 0;
    AbbrOffset = isUnitDWARF64 ? DebugInfoData.getU64(Offset) : DebugInfoData.getU32(Offset);
    AddrSize = DebugInfoData.getU8(Offset);
  }

  if (!DCtx.getDebugAbbrev()->getAbbreviationDeclarationSet(AbbrOffset))
    ValidAbbrevOffset = false;

  ValidLength = DebugInfoData.isValidOffset(OffsetStart + Length + 3);
  ValidVersion = DWARFContext::isSupportedVersion(Version);
  ValidAddrSize = AddrSize == 4 || AddrSize == 8;
  if (!ValidLength || !ValidVersion || !ValidAddrSize || !ValidAbbrevOffset ||
      !ValidType) {
    Success = false;
    error() << format("Units[%d] - start offset: 0x%08" PRIx64 " \n", UnitIndex,
                      OffsetStart);
    if (!ValidLength)
      note() << "The length for this unit is too "
                "large for the .debug_info provided.\n";
    if (!ValidVersion)
      note() << "The 16 bit unit header version is not valid.\n";
    if (!ValidType)
      note() << "The unit type encoding is not valid.\n";
    if (!ValidAbbrevOffset)
      note() << "The offset into the .debug_abbrev section is "
                "not valid.\n";
    if (!ValidAddrSize)
      note() << "The address size is unsupported.\n";
  }
  *Offset = OffsetStart + Length + (isUnitDWARF64 ? 12 : 4);
  return Success;
}